

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::verifyInt8(WasmBinaryReader *this,int8_t x)

{
  uint8_t uVar1;
  string local_40;
  allocator<char> local_19;
  
  uVar1 = getInt8(this);
  if (uVar1 == x) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"surprising value",&local_19);
  throwError(this,&local_40);
}

Assistant:

void WasmBinaryReader::verifyInt8(int8_t x) {
  int8_t y = getInt8();
  if (x != y) {
    throwError("surprising value");
  }
}